

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

mz_bool mz_zip_reader_file_stat
                  (mz_zip_archive *pZip,mz_uint file_index,mz_zip_archive_file_stat *pStat)

{
  byte bVar1;
  mz_zip_internal_state *pmVar2;
  void *pvVar3;
  void *pvVar4;
  uint uVar5;
  mz_bool mVar6;
  time_t tVar7;
  ulong uVar8;
  tm local_60;
  
  mVar6 = 0;
  if ((((pZip != (mz_zip_archive *)0x0) &&
       (pmVar2 = pZip->m_pState, pmVar2 != (mz_zip_internal_state *)0x0)) &&
      (file_index < pZip->m_total_files)) &&
     ((pZip->m_zip_mode == MZ_ZIP_MODE_READING &&
      (pvVar3 = (pmVar2->m_central_dir).m_p, mVar6 = 0,
      pStat != (mz_zip_archive_file_stat *)0x0 && pvVar3 != (void *)0x0)))) {
    pvVar4 = (pmVar2->m_central_dir_offsets).m_p;
    uVar8 = (ulong)*(uint *)((long)pvVar4 + (ulong)file_index * 4);
    pStat->m_file_index = file_index;
    pStat->m_central_dir_ofs = *(mz_uint32 *)((long)pvVar4 + (ulong)file_index * 4);
    pvVar4 = (void *)((long)pvVar3 + uVar8 + 0x2e);
    pStat->m_version_made_by = *(mz_uint16 *)((long)pvVar4 + -0x2a);
    pStat->m_version_needed = *(mz_uint16 *)((long)pvVar4 + -0x28);
    pStat->m_bit_flag = *(mz_uint16 *)((long)pvVar4 + -0x26);
    pStat->m_method = *(mz_uint16 *)((long)pvVar4 + -0x24);
    bVar1 = *(byte *)((long)pvVar4 + -0x22);
    local_60.tm_wday = 0;
    local_60.tm_yday = 0;
    local_60.tm_gmtoff = 0;
    local_60.tm_zone = (char *)0x0;
    local_60.tm_isdst = -1;
    local_60._36_4_ = 0;
    local_60.tm_year = (*(byte *)((long)pvVar4 + -0x1f) >> 1) + 0x50;
    local_60.tm_mon = (*(ushort *)((long)pvVar4 + -0x20) >> 5 & 0xf) - 1;
    local_60.tm_mday = *(byte *)((long)pvVar4 + -0x20) & 0x1f;
    local_60.tm_hour = (int)(*(byte *)((long)pvVar4 + -0x21) >> 3);
    local_60.tm_min = *(ushort *)((long)pvVar4 + -0x22) >> 5 & 0x3f;
    local_60.tm_sec = (uint)bVar1 + (uint)bVar1 & 0x3e;
    tVar7 = mktime(&local_60);
    pStat->m_time = tVar7;
    pStat->m_crc32 = *(mz_uint32 *)((long)pvVar4 + -0x1e);
    pStat->m_comp_size = (ulong)*(uint *)((long)pvVar4 + -0x1a);
    pStat->m_uncomp_size = (ulong)*(uint *)((long)pvVar4 + -0x16);
    pStat->m_internal_attr = *(mz_uint16 *)((long)pvVar4 + -10);
    pStat->m_external_attr = *(mz_uint32 *)((long)pvVar4 + -8);
    pStat->m_local_header_ofs = (ulong)*(uint *)((long)pvVar4 + -4);
    uVar5 = 0x103;
    if (*(ushort *)((long)pvVar4 + -0x12) < 0x103) {
      uVar5 = (uint)*(ushort *)((long)pvVar4 + -0x12);
    }
    memcpy(pStat->m_filename,pvVar4,(ulong)uVar5);
    pStat->m_filename[uVar5] = '\0';
    uVar5 = 0xff;
    if (*(ushort *)((long)pvVar4 + -0xe) < 0xff) {
      uVar5 = (uint)*(ushort *)((long)pvVar4 + -0xe);
    }
    pStat->m_comment_size = uVar5;
    memcpy(pStat->m_comment,
           (void *)((long)pvVar3 +
                   (ulong)*(ushort *)((long)pvVar4 + -0x10) +
                   *(ushort *)((long)pvVar4 + -0x12) + uVar8 + 0x2e),(ulong)uVar5);
    pStat->m_comment[uVar5] = '\0';
    mVar6 = 1;
  }
  return mVar6;
}

Assistant:

mz_bool mz_zip_reader_file_stat(mz_zip_archive *pZip, mz_uint file_index,
                                mz_zip_archive_file_stat *pStat) {
  mz_uint n;
  const mz_uint8 *p = mz_zip_reader_get_cdh(pZip, file_index);
  if ((!p) || (!pStat)) return MZ_FALSE;

  // Unpack the central directory record.
  pStat->m_file_index = file_index;
  pStat->m_central_dir_ofs = MZ_ZIP_ARRAY_ELEMENT(
      &pZip->m_pState->m_central_dir_offsets, mz_uint32, file_index);
  pStat->m_version_made_by = MZ_READ_LE16(p + MZ_ZIP_CDH_VERSION_MADE_BY_OFS);
  pStat->m_version_needed = MZ_READ_LE16(p + MZ_ZIP_CDH_VERSION_NEEDED_OFS);
  pStat->m_bit_flag = MZ_READ_LE16(p + MZ_ZIP_CDH_BIT_FLAG_OFS);
  pStat->m_method = MZ_READ_LE16(p + MZ_ZIP_CDH_METHOD_OFS);
#ifndef MINIZ_NO_TIME
  pStat->m_time =
      mz_zip_dos_to_time_t(MZ_READ_LE16(p + MZ_ZIP_CDH_FILE_TIME_OFS),
                           MZ_READ_LE16(p + MZ_ZIP_CDH_FILE_DATE_OFS));
#endif
  pStat->m_crc32 = MZ_READ_LE32(p + MZ_ZIP_CDH_CRC32_OFS);
  pStat->m_comp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);
  pStat->m_uncomp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS);
  pStat->m_internal_attr = MZ_READ_LE16(p + MZ_ZIP_CDH_INTERNAL_ATTR_OFS);
  pStat->m_external_attr = MZ_READ_LE32(p + MZ_ZIP_CDH_EXTERNAL_ATTR_OFS);
  pStat->m_local_header_ofs = MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS);

  // Copy as much of the filename and comment as possible.
  n = MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS);
  n = MZ_MIN(n, MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE - 1);
  memcpy(pStat->m_filename, p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, n);
  pStat->m_filename[n] = '\0';

  n = MZ_READ_LE16(p + MZ_ZIP_CDH_COMMENT_LEN_OFS);
  n = MZ_MIN(n, MZ_ZIP_MAX_ARCHIVE_FILE_COMMENT_SIZE - 1);
  pStat->m_comment_size = n;
  memcpy(pStat->m_comment, p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
                               MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS) +
                               MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS),
         n);
  pStat->m_comment[n] = '\0';

  return MZ_TRUE;
}